

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int codeDistinct(Parse *pParse,int eTnctType,int iTab,int addrRepeat,ExprList *pEList,int regElem)

{
  byte bVar1;
  uint p4;
  Vdbe *p;
  int iVar2;
  CollSeq *zP4;
  int p2;
  int op;
  ulong uVar3;
  ExprList_item *pEVar4;
  ulong uVar5;
  
  if (eTnctType == 1) {
    iTab = 0;
  }
  else {
    p4 = pEList->nExpr;
    p = pParse->pVdbe;
    if (eTnctType == 2) {
      iTab = pParse->nMem + 1;
      pParse->nMem = pParse->nMem + p4;
      iVar2 = p->nOp;
      pEVar4 = pEList->a;
      uVar5 = 0;
      uVar3 = 0;
      if (0 < (int)p4) {
        uVar3 = (ulong)p4;
      }
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar4->pExpr);
        if ((long)uVar5 < (long)(int)p4 + -1) {
          op = 0x34;
          p2 = iVar2 + p4;
        }
        else {
          op = 0x35;
          p2 = addrRepeat;
        }
        sqlite3VdbeAddOp3(p,op,regElem + (int)uVar5,p2,iTab + (int)uVar5);
        sqlite3VdbeChangeP4(p,-1,(char *)zP4,-2);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 0x80;
        }
        pEVar4 = pEVar4 + 1;
      }
      sqlite3VdbeAddOp3(p,0x50,regElem,iTab,(int)((long)(int)p4 + -1));
    }
    else {
      iVar2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4Int(p,0x1c,iTab,addrRepeat,regElem,p4);
      sqlite3VdbeAddOp3(p,0x61,regElem,p4,iVar2);
      sqlite3VdbeAddOp4Int(p,0x8a,iTab,iVar2,regElem,p4);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      if (iVar2 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar2;
        }
      }
    }
  }
  return iTab;
}

Assistant:

static int codeDistinct(
  Parse *pParse,     /* Parsing and code generating context */
  int eTnctType,     /* WHERE_DISTINCT_* value */
  int iTab,          /* A sorting index used to test for distinctness */
  int addrRepeat,    /* Jump to here if not distinct */
  ExprList *pEList,  /* Expression for each element */
  int regElem        /* First element */
){
  int iRet = 0;
  int nResultCol = pEList->nExpr;
  Vdbe *v = pParse->pVdbe;

  switch( eTnctType ){
    case WHERE_DISTINCT_ORDERED: {
      int i;
      int iJump;              /* Jump destination */
      int regPrev;            /* Previous row content */

      /* Allocate space for the previous row */
      iRet = regPrev = pParse->nMem+1;
      pParse->nMem += nResultCol;

      iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
      for(i=0; i<nResultCol; i++){
        CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
        if( i<nResultCol-1 ){
          sqlite3VdbeAddOp3(v, OP_Ne, regElem+i, iJump, regPrev+i);
          VdbeCoverage(v);
        }else{
          sqlite3VdbeAddOp3(v, OP_Eq, regElem+i, addrRepeat, regPrev+i);
          VdbeCoverage(v);
         }
        sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      }
      assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
      sqlite3VdbeAddOp3(v, OP_Copy, regElem, regPrev, nResultCol-1);
      break;
    }

    case WHERE_DISTINCT_UNIQUE: {
      /* nothing to do */
      break;
    }

    default: {
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4Int(v, OP_Found, iTab, addrRepeat, regElem, nResultCol);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regElem, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r1, regElem, nResultCol);
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      sqlite3ReleaseTempReg(pParse, r1);
      iRet = iTab;
      break;
    }
  }

  return iRet;
}